

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-i2c.c
# Opt level: O0

void print_bus(mraa_board_t *board)

{
  uint uVar1;
  char *pcStack_20;
  int id;
  char *busType;
  int bus;
  int i;
  mraa_board_t *board_local;
  
  for (busType._4_4_ = 0; (int)busType._4_4_ < board->i2c_bus_count;
      busType._4_4_ = busType._4_4_ + 1) {
    if (board->platform_type == MRAA_FTDI_FT4222) {
      pcStack_20 = "ft4222";
      busType._0_4_ = mraa_get_sub_platform_id(busType._4_4_);
    }
    else {
      pcStack_20 = "linux";
      busType._0_4_ = busType._4_4_;
    }
    uVar1 = board->i2c_bus[(int)busType._4_4_].bus_id;
    fprintf(_stdout,"Bus %3d: id=%02d type=%s ",(ulong)(uint)busType,(ulong)uVar1,pcStack_20);
    if (busType._4_4_ == board->def_i2c_bus) {
      fprintf(_stdout," default");
    }
    if (uVar1 == 0xffffffff) {
      fprintf(_stdout," disabled");
    }
    fprintf(_stdout,"\n");
  }
  return;
}

Assistant:

void
print_bus(mraa_board_t* board)
{
    int i, bus;
    for (i = 0; i < board->i2c_bus_count; ++i) {
        char* busType;
        switch (board->platform_type) {
            case MRAA_FTDI_FT4222:
                busType = "ft4222";
                bus = mraa_get_sub_platform_id(i);
                break;
            default:
                busType = "linux";
                bus = i;
                break;
        }
        int id = board->i2c_bus[i].bus_id;
        fprintf(stdout, "Bus %3d: id=%02d type=%s ", bus, id, busType);
        if (i == board->def_i2c_bus)
            fprintf(stdout, " default");
        if (id == -1)
            fprintf(stdout, " disabled");

        fprintf(stdout, "\n");
    }
}